

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_edge_sse4.c
# Opt level: O3

void av1_filter_intra_edge_sse4_1(uint8_t *p,int sz,int strength)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 (*pauVar11) [16];
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  undefined1 (*pauVar16) [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  char cVar19;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  undefined1 in_XMM2 [16];
  undefined1 auVar20 [16];
  char cVar35;
  undefined1 in_XMM3 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  
  if (strength != 0) {
    p[-1] = *p;
    lVar15 = (long)sz;
    uVar13 = lVar15 - 1;
    auVar17 = pshufb(ZEXT116(p[lVar15 + -1]),(undefined1  [16])0x0);
    pauVar11 = (undefined1 (*) [16])(p + -1);
    if (strength != 3) {
      pauVar11 = (undefined1 (*) [16])p;
    }
    *(undefined1 (*) [16])(p + lVar15) = auVar17;
    pauVar16 = (undefined1 (*) [16])(p + 1);
    if (strength < 3) {
      auVar17 = lddqu((undefined1  [16])0x0,
                      (undefined1  [16])av1_filter_intra_edge_sse4_1::kern[(int)(strength - 1U)]);
      auVar20 = lddqu(in_XMM2,(undefined1  [16])av1_filter_intra_edge_sse4_1::v_const[0]);
      auVar36 = lddqu(in_XMM3,(undefined1  [16])av1_filter_intra_edge_sse4_1::v_const[1]);
      auVar37 = lddqu(in_XMM4,(undefined1  [16])av1_filter_intra_edge_sse4_1::v_const[3]);
      if (1 < sz) {
        auVar39 = lddqu(in_XMM7,*(undefined1 (*) [16])p);
        pauVar11 = pauVar11 + 1;
        auVar38 = pmovsxbw(in_XMM5,0x808080808080808);
        do {
          uVar12 = (uint)uVar13;
          auVar40 = pshufb(auVar39,auVar20);
          auVar18 = pshufb(auVar39,auVar36);
          auVar40 = pmaddubsw(auVar40,auVar17);
          auVar18 = pmaddubsw(auVar18,auVar17);
          auVar18 = phaddw(auVar40,auVar18);
          uVar14 = 8;
          if (uVar12 < 8) {
            uVar14 = uVar12;
          }
          auVar42._0_2_ = auVar18._0_2_ + auVar38._0_2_;
          auVar42._2_2_ = auVar18._2_2_ + auVar38._2_2_;
          auVar42._4_2_ = auVar18._4_2_ + auVar38._4_2_;
          auVar42._6_2_ = auVar18._6_2_ + auVar38._6_2_;
          auVar42._8_2_ = auVar18._8_2_ + auVar38._8_2_;
          auVar42._10_2_ = auVar18._10_2_ + auVar38._10_2_;
          auVar42._12_2_ = auVar18._12_2_ + auVar38._12_2_;
          auVar42._14_2_ = auVar18._14_2_ + auVar38._14_2_;
          auVar18 = psraw(auVar42,4);
          sVar1 = auVar18._0_2_;
          sVar2 = auVar18._2_2_;
          auVar41[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar18[2] - (0xff < sVar2);
          auVar41[0] = (0 < sVar1) * (sVar1 < 0x100) * auVar18[0] - (0xff < sVar1);
          sVar3 = auVar18._4_2_;
          auVar41[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar18[4] - (0xff < sVar3);
          sVar4 = auVar18._6_2_;
          auVar41[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar18[6] - (0xff < sVar4);
          sVar5 = auVar18._8_2_;
          auVar41[4] = (0 < sVar5) * (sVar5 < 0x100) * auVar18[8] - (0xff < sVar5);
          sVar6 = auVar18._10_2_;
          auVar41[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar18[10] - (0xff < sVar6);
          sVar7 = auVar18._12_2_;
          auVar41[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar18[0xc] - (0xff < sVar7);
          sVar8 = auVar18._14_2_;
          auVar41[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar18[0xe] - (0xff < sVar8);
          auVar41[8] = (0 < sVar1) * (sVar1 < 0x100) * auVar18[0] - (0xff < sVar1);
          auVar41[9] = (0 < sVar2) * (sVar2 < 0x100) * auVar18[2] - (0xff < sVar2);
          auVar41[10] = (0 < sVar3) * (sVar3 < 0x100) * auVar18[4] - (0xff < sVar3);
          auVar41[0xb] = (0 < sVar4) * (sVar4 < 0x100) * auVar18[6] - (0xff < sVar4);
          auVar41[0xc] = (0 < sVar5) * (sVar5 < 0x100) * auVar18[8] - (0xff < sVar5);
          auVar41[0xd] = (0 < sVar6) * (sVar6 < 0x100) * auVar18[10] - (0xff < sVar6);
          auVar41[0xe] = (0 < sVar7) * (sVar7 < 0x100) * auVar18[0xc] - (0xff < sVar7);
          auVar41[0xf] = (0 < sVar8) * (sVar8 < 0x100) * auVar18[0xe] - (0xff < sVar8);
          auVar42 = lddqu(in_XMM9,*pauVar16);
          auVar18 = pshufb(ZEXT416(uVar14),(undefined1  [16])0x0);
          auVar40[0] = -(auVar37[0] < auVar18[0]);
          auVar40[1] = -(auVar37[1] < auVar18[1]);
          auVar40[2] = -(auVar37[2] < auVar18[2]);
          auVar40[3] = -(auVar37[3] < auVar18[3]);
          auVar40[4] = -(auVar37[4] < auVar18[4]);
          auVar40[5] = -(auVar37[5] < auVar18[5]);
          auVar40[6] = -(auVar37[6] < auVar18[6]);
          auVar40[7] = -(auVar37[7] < auVar18[7]);
          auVar40[8] = -(auVar37[8] < auVar18[8]);
          auVar40[9] = -(auVar37[9] < auVar18[9]);
          auVar40[10] = -(auVar37[10] < auVar18[10]);
          auVar40[0xb] = -(auVar37[0xb] < auVar18[0xb]);
          auVar40[0xc] = -(auVar37[0xc] < auVar18[0xc]);
          auVar40[0xd] = -(auVar37[0xd] < auVar18[0xd]);
          auVar40[0xe] = -(auVar37[0xe] < auVar18[0xe]);
          auVar40[0xf] = -(auVar37[0xf] < auVar18[0xf]);
          in_XMM9 = pblendvb(auVar42,auVar41,auVar40);
          *(long *)*pauVar16 = in_XMM9._0_8_;
          auVar18 = lddqu(auVar40,*pauVar11);
          auVar9._16_16_ = auVar18;
          auVar9._0_16_ = auVar39;
          auVar39 = auVar9._8_16_;
          pauVar16 = (undefined1 (*) [16])(*pauVar16 + 8);
          pauVar11 = (undefined1 (*) [16])(*pauVar11 + 8);
          uVar13 = (ulong)(uVar12 - uVar14);
        } while (uVar12 - uVar14 != 0 && (int)uVar14 <= (int)uVar12);
      }
    }
    else {
      auVar17 = lddqu((undefined1  [16])0x0,
                      (undefined1  [16])av1_filter_intra_edge_sse4_1::kern[strength - 1U]);
      auVar20 = lddqu(in_XMM2,(undefined1  [16])av1_filter_intra_edge_sse4_1::v_const[2]);
      auVar36 = lddqu(in_XMM3,(undefined1  [16])av1_filter_intra_edge_sse4_1::v_const[3]);
      if (1 < sz) {
        cVar19 = auVar20[0];
        auVar39[0] = cVar19 + '\x02';
        cVar21 = auVar20[1];
        auVar39[1] = cVar21 + '\x02';
        cVar22 = auVar20[2];
        auVar39[2] = cVar22 + '\x02';
        cVar23 = auVar20[3];
        auVar39[3] = cVar23 + '\x02';
        cVar24 = auVar20[4];
        auVar39[4] = cVar24 + '\x02';
        cVar25 = auVar20[5];
        auVar39[5] = cVar25 + '\x02';
        cVar26 = auVar20[6];
        auVar39[6] = cVar26 + '\x02';
        cVar27 = auVar20[7];
        auVar39[7] = cVar27 + '\x02';
        cVar28 = auVar20[8];
        auVar39[8] = cVar28 + '\x02';
        cVar29 = auVar20[9];
        auVar39[9] = cVar29 + '\x02';
        cVar30 = auVar20[10];
        auVar39[10] = cVar30 + '\x02';
        cVar31 = auVar20[0xb];
        auVar39[0xb] = cVar31 + '\x02';
        cVar32 = auVar20[0xc];
        auVar39[0xc] = cVar32 + '\x02';
        cVar33 = auVar20[0xd];
        auVar39[0xd] = cVar33 + '\x02';
        cVar34 = auVar20[0xe];
        auVar39[0xe] = cVar34 + '\x02';
        cVar35 = auVar20[0xf];
        auVar39[0xf] = cVar35 + '\x02';
        auVar38[0] = cVar19 + '\x04';
        auVar38[1] = cVar21 + '\x04';
        auVar38[2] = cVar22 + '\x04';
        auVar38[3] = cVar23 + '\x04';
        auVar38[4] = cVar24 + '\x04';
        auVar38[5] = cVar25 + '\x04';
        auVar38[6] = cVar26 + '\x04';
        auVar38[7] = cVar27 + '\x04';
        auVar38[8] = cVar28 + '\x04';
        auVar38[9] = cVar29 + '\x04';
        auVar38[10] = cVar30 + '\x04';
        auVar38[0xb] = cVar31 + '\x04';
        auVar38[0xc] = cVar32 + '\x04';
        auVar38[0xd] = cVar33 + '\x04';
        auVar38[0xe] = cVar34 + '\x04';
        auVar38[0xf] = cVar35 + '\x04';
        auVar18[0] = cVar19 + '\x06';
        auVar18[1] = cVar21 + '\x06';
        auVar18[2] = cVar22 + '\x06';
        auVar18[3] = cVar23 + '\x06';
        auVar18[4] = cVar24 + '\x06';
        auVar18[5] = cVar25 + '\x06';
        auVar18[6] = cVar26 + '\x06';
        auVar18[7] = cVar27 + '\x06';
        auVar18[8] = cVar28 + '\x06';
        auVar18[9] = cVar29 + '\x06';
        auVar18[10] = cVar30 + '\x06';
        auVar18[0xb] = cVar31 + '\x06';
        auVar18[0xc] = cVar32 + '\x06';
        auVar18[0xd] = cVar33 + '\x06';
        auVar18[0xe] = cVar34 + '\x06';
        auVar18[0xf] = cVar35 + '\x06';
        auVar37 = lddqu(in_XMM9,*pauVar11);
        pauVar11 = pauVar11 + 1;
        auVar40 = pmovsxbw(in_XMM7,0x808080808080808);
        do {
          uVar12 = (uint)uVar13;
          auVar43 = pshufb(auVar37,auVar20);
          auVar42 = pshufb(auVar37,auVar39);
          auVar44 = pshufb(auVar37,auVar38);
          auVar45 = pshufb(auVar37,auVar18);
          auVar43 = pmaddubsw(auVar43,auVar17);
          auVar42 = pmaddubsw(auVar42,auVar17);
          auVar42 = phaddw(auVar43,auVar42);
          auVar43 = pmaddubsw(auVar44,auVar17);
          auVar44 = pmaddubsw(auVar45,auVar17);
          auVar43 = phaddw(auVar43,auVar44);
          auVar42 = phaddw(auVar42,auVar43);
          uVar14 = 8;
          if (uVar12 < 8) {
            uVar14 = uVar12;
          }
          auVar44._0_2_ = auVar42._0_2_ + auVar40._0_2_;
          auVar44._2_2_ = auVar42._2_2_ + auVar40._2_2_;
          auVar44._4_2_ = auVar42._4_2_ + auVar40._4_2_;
          auVar44._6_2_ = auVar42._6_2_ + auVar40._6_2_;
          auVar44._8_2_ = auVar42._8_2_ + auVar40._8_2_;
          auVar44._10_2_ = auVar42._10_2_ + auVar40._10_2_;
          auVar44._12_2_ = auVar42._12_2_ + auVar40._12_2_;
          auVar44._14_2_ = auVar42._14_2_ + auVar40._14_2_;
          auVar42 = psraw(auVar44,4);
          sVar1 = auVar42._0_2_;
          sVar2 = auVar42._2_2_;
          auVar45[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar42[2] - (0xff < sVar2);
          auVar45[0] = (0 < sVar1) * (sVar1 < 0x100) * auVar42[0] - (0xff < sVar1);
          sVar3 = auVar42._4_2_;
          auVar45[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar42[4] - (0xff < sVar3);
          sVar4 = auVar42._6_2_;
          auVar45[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar42[6] - (0xff < sVar4);
          sVar5 = auVar42._8_2_;
          auVar45[4] = (0 < sVar5) * (sVar5 < 0x100) * auVar42[8] - (0xff < sVar5);
          sVar6 = auVar42._10_2_;
          auVar45[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar42[10] - (0xff < sVar6);
          sVar7 = auVar42._12_2_;
          auVar45[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar42[0xc] - (0xff < sVar7);
          sVar8 = auVar42._14_2_;
          auVar45[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar42[0xe] - (0xff < sVar8);
          auVar45[8] = (0 < sVar1) * (sVar1 < 0x100) * auVar42[0] - (0xff < sVar1);
          auVar45[9] = (0 < sVar2) * (sVar2 < 0x100) * auVar42[2] - (0xff < sVar2);
          auVar45[10] = (0 < sVar3) * (sVar3 < 0x100) * auVar42[4] - (0xff < sVar3);
          auVar45[0xb] = (0 < sVar4) * (sVar4 < 0x100) * auVar42[6] - (0xff < sVar4);
          auVar45[0xc] = (0 < sVar5) * (sVar5 < 0x100) * auVar42[8] - (0xff < sVar5);
          auVar45[0xd] = (0 < sVar6) * (sVar6 < 0x100) * auVar42[10] - (0xff < sVar6);
          auVar45[0xe] = (0 < sVar7) * (sVar7 < 0x100) * auVar42[0xc] - (0xff < sVar7);
          auVar45[0xf] = (0 < sVar8) * (sVar8 < 0x100) * auVar42[0xe] - (0xff < sVar8);
          auVar44 = lddqu(auVar43,*pauVar16);
          auVar42 = pshufb(ZEXT416(uVar14),(undefined1  [16])0x0);
          auVar43[0] = -(auVar36[0] < auVar42[0]);
          auVar43[1] = -(auVar36[1] < auVar42[1]);
          auVar43[2] = -(auVar36[2] < auVar42[2]);
          auVar43[3] = -(auVar36[3] < auVar42[3]);
          auVar43[4] = -(auVar36[4] < auVar42[4]);
          auVar43[5] = -(auVar36[5] < auVar42[5]);
          auVar43[6] = -(auVar36[6] < auVar42[6]);
          auVar43[7] = -(auVar36[7] < auVar42[7]);
          auVar43[8] = -(auVar36[8] < auVar42[8]);
          auVar43[9] = -(auVar36[9] < auVar42[9]);
          auVar43[10] = -(auVar36[10] < auVar42[10]);
          auVar43[0xb] = -(auVar36[0xb] < auVar42[0xb]);
          auVar43[0xc] = -(auVar36[0xc] < auVar42[0xc]);
          auVar43[0xd] = -(auVar36[0xd] < auVar42[0xd]);
          auVar43[0xe] = -(auVar36[0xe] < auVar42[0xe]);
          auVar43[0xf] = -(auVar36[0xf] < auVar42[0xf]);
          auVar42 = pblendvb(auVar44,auVar45,auVar43);
          *(long *)*pauVar16 = auVar42._0_8_;
          auVar42 = lddqu(auVar43,*pauVar11);
          auVar10._16_16_ = auVar42;
          auVar10._0_16_ = auVar37;
          auVar37 = auVar10._8_16_;
          pauVar16 = (undefined1 (*) [16])(*pauVar16 + 8);
          pauVar11 = (undefined1 (*) [16])(*pauVar11 + 8);
          uVar13 = (ulong)(uVar12 - uVar14);
        } while (uVar12 - uVar14 != 0 && (int)uVar14 <= (int)uVar12);
      }
    }
  }
  return;
}

Assistant:

void av1_filter_intra_edge_sse4_1(uint8_t *p, int sz, int strength) {
  if (!strength) return;

  DECLARE_ALIGNED(16, static const int8_t, kern[3][16]) = {
    { 4, 8, 4, 0, 4, 8, 4, 0, 4, 8, 4, 0, 4, 8, 4, 0 },  // strength 1: 4,8,4
    { 5, 6, 5, 0, 5, 6, 5, 0, 5, 6, 5, 0, 5, 6, 5, 0 },  // strength 2: 5,6,5
    { 2, 4, 4, 4, 2, 0, 0, 0, 2, 4, 4, 4, 2, 0, 0, 0 }  // strength 3: 2,4,4,4,2
  };

  DECLARE_ALIGNED(16, static const int8_t, v_const[5][16]) = {
    { 0, 1, 2, 3, 1, 2, 3, 4, 2, 3, 4, 5, 3, 4, 5, 6 },
    { 4, 5, 6, 7, 5, 6, 7, 8, 6, 7, 8, 9, 7, 8, 9, 10 },
    { 0, 1, 2, 3, 4, 5, 6, 7, 1, 2, 3, 4, 5, 6, 7, 8 },
    { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 },
  };

  // Extend the first and last samples to simplify the loop for the 5-tap case
  p[-1] = p[0];
  __m128i last = _mm_set1_epi8((char)p[sz - 1]);
  _mm_storeu_si128((__m128i *)&p[sz], last);

  // Adjust input pointer for filter support area
  uint8_t *in = (strength == 3) ? p - 1 : p;

  // Avoid modifying first sample
  uint8_t *out = p + 1;
  int len = sz - 1;

  const int use_3tap_filter = (strength < 3);

  if (use_3tap_filter) {
    __m128i coef0 = _mm_lddqu_si128((__m128i const *)kern[strength - 1]);
    __m128i shuf0 = _mm_lddqu_si128((__m128i const *)v_const[0]);
    __m128i shuf1 = _mm_lddqu_si128((__m128i const *)v_const[1]);
    __m128i iden = _mm_lddqu_si128((__m128i *)v_const[3]);
    __m128i in0 = _mm_lddqu_si128((__m128i *)in);
    while (len > 0) {
      int n_out = (len < 8) ? len : 8;
      __m128i d0 = _mm_shuffle_epi8(in0, shuf0);
      __m128i d1 = _mm_shuffle_epi8(in0, shuf1);
      d0 = _mm_maddubs_epi16(d0, coef0);
      d1 = _mm_maddubs_epi16(d1, coef0);
      d0 = _mm_hadd_epi16(d0, d1);
      __m128i eight = _mm_set1_epi16(8);
      d0 = _mm_add_epi16(d0, eight);
      d0 = _mm_srai_epi16(d0, 4);
      d0 = _mm_packus_epi16(d0, d0);
      __m128i out0 = _mm_lddqu_si128((__m128i *)out);
      __m128i n0 = _mm_set1_epi8(n_out);
      __m128i mask = _mm_cmpgt_epi8(n0, iden);
      out0 = _mm_blendv_epi8(out0, d0, mask);
      _mm_storel_epi64((__m128i *)out, out0);
      __m128i in1 = _mm_lddqu_si128((__m128i *)(in + 16));
      in0 = _mm_alignr_epi8(in1, in0, 8);
      in += 8;
      out += 8;
      len -= n_out;
    }
  } else {  // 5-tap filter
    __m128i coef0 = _mm_lddqu_si128((__m128i const *)kern[strength - 1]);
    __m128i two = _mm_set1_epi8(2);
    __m128i shuf_a = _mm_lddqu_si128((__m128i const *)v_const[2]);
    __m128i shuf_b = _mm_add_epi8(shuf_a, two);
    __m128i shuf_c = _mm_add_epi8(shuf_b, two);
    __m128i shuf_d = _mm_add_epi8(shuf_c, two);
    __m128i iden = _mm_lddqu_si128((__m128i *)v_const[3]);
    __m128i in0 = _mm_lddqu_si128((__m128i *)in);
    while (len > 0) {
      int n_out = (len < 8) ? len : 8;
      __m128i d0 = _mm_shuffle_epi8(in0, shuf_a);
      __m128i d1 = _mm_shuffle_epi8(in0, shuf_b);
      __m128i d2 = _mm_shuffle_epi8(in0, shuf_c);
      __m128i d3 = _mm_shuffle_epi8(in0, shuf_d);
      d0 = _mm_maddubs_epi16(d0, coef0);
      d1 = _mm_maddubs_epi16(d1, coef0);
      d2 = _mm_maddubs_epi16(d2, coef0);
      d3 = _mm_maddubs_epi16(d3, coef0);
      d0 = _mm_hadd_epi16(d0, d1);
      d2 = _mm_hadd_epi16(d2, d3);
      d0 = _mm_hadd_epi16(d0, d2);
      __m128i eight = _mm_set1_epi16(8);
      d0 = _mm_add_epi16(d0, eight);
      d0 = _mm_srai_epi16(d0, 4);
      d0 = _mm_packus_epi16(d0, d0);
      __m128i out0 = _mm_lddqu_si128((__m128i *)out);
      __m128i n0 = _mm_set1_epi8(n_out);
      __m128i mask = _mm_cmpgt_epi8(n0, iden);
      out0 = _mm_blendv_epi8(out0, d0, mask);
      _mm_storel_epi64((__m128i *)out, out0);
      __m128i in1 = _mm_lddqu_si128((__m128i *)(in + 16));
      in0 = _mm_alignr_epi8(in1, in0, 8);
      in += 8;
      out += 8;
      len -= n_out;
    }
  }
}